

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O3

Ivy_Store_t * Ivy_CutComputeForNode(Ivy_Man_t *p,Ivy_Obj_t *pObj,int nLeaves)

{
  short sVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Ivy_Store_t *extraout_RAX;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  Ivy_Cut_t CutNew;
  Ivy_Cut_t local_54;
  
  Ivy_CutComputeForNode::CutStore.nCutsMax = 0x100;
  local_54.nSize = 1;
  local_54.nSizeMax = (short)nLeaves;
  local_54.pArray[0] = (int)pObj << 8;
  Ivy_CutComputeForNode::CutStore.pCuts[0].uHash =
       1 << (((char)(uint)((ulong)((long)local_54.pArray[0] * 0x84210843) >> 0x24) -
             ((char)((ulong)pObj >> 0x10) >> 7)) * -0x1f & 0x1fU);
  iVar7 = 1;
  Ivy_CutComputeForNode::CutStore.nCuts = 1;
  Ivy_CutComputeForNode::CutStore.pCuts[0].pArray._8_8_ = local_54.pArray._8_8_;
  Ivy_CutComputeForNode::CutStore.pCuts[0].pArray._16_8_ = local_54.pArray._16_8_;
  Ivy_CutComputeForNode::CutStore.pCuts[0].nSize = 1;
  Ivy_CutComputeForNode::CutStore.pCuts[0].nLatches = local_54.nLatches;
  Ivy_CutComputeForNode::CutStore.pCuts[0].nSizeMax = local_54.nSizeMax;
  Ivy_CutComputeForNode::CutStore.pCuts[0].pArray[1] = local_54.pArray[1];
  Ivy_CutComputeForNode::CutStore.pCuts[0].pArray[0] = local_54.pArray[0];
  lVar16 = 0xddbf48;
  lVar12 = 0;
  local_54.uHash = Ivy_CutComputeForNode::CutStore.pCuts[0].uHash;
  do {
    uVar8 = Ivy_CutComputeForNode::CutStore.pCuts[lVar12].nSize;
    if (uVar8 != 0) {
      if (0 < (short)uVar8) {
        lVar17 = 0;
        do {
          uVar9 = *(uint *)(lVar12 * 0x24 + 0xddbf48 + lVar17 * 4);
          uVar4 = (int)uVar9 >> 8;
          if (((int)uVar4 < 0) || (p->vObjs->nSize <= (int)uVar4)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          piVar3 = (int *)p->vObjs->pArray[uVar4];
          uVar4 = piVar3[2] & 0xf;
          if (((uVar4 != 1) && (uVar4 != 4)) && (*piVar3 != 0)) {
            if (uVar4 - 7 < 0xfffffffe) {
              __assert_fail("Ivy_ObjIsNode(pLeaf)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivySeq.c"
                            ,0x425,
                            "Ivy_Store_t *Ivy_CutComputeForNode(Ivy_Man_t *, Ivy_Obj_t *, int)");
            }
            uVar9 = uVar9 & 0xff;
            uVar4 = Ivy_CutReadLeaf((Ivy_Obj_t *)(*(ulong *)(piVar3 + 4) & 0xfffffffffffffffe));
            uVar5 = Ivy_CutReadLeaf((Ivy_Obj_t *)(*(ulong *)(piVar3 + 6) & 0xfffffffffffffffe));
            if ((0xfe < (uVar4 & 0xff) + uVar9) || (0xfe < (uVar5 & 0xff) + uVar9)) {
              __assert_fail("nLats + Ivy_LeafLat(iLeaf0) < IVY_LEAF_MASK && nLats + Ivy_LeafLat(iLeaf1) < IVY_LEAF_MASK"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivySeq.c"
                            ,0x42b,
                            "Ivy_Store_t *Ivy_CutComputeForNode(Ivy_Man_t *, Ivy_Obj_t *, int)");
            }
            iVar7 = uVar4 + uVar9;
            iVar10 = uVar9 + uVar5;
            uVar8 = Ivy_CutComputeForNode::CutStore.pCuts[lVar12].nSize;
            sVar1 = Ivy_CutComputeForNode::CutStore.pCuts[lVar12].nSizeMax;
            if ((short)uVar8 < sVar1) {
LAB_007a229c:
              iVar11 = iVar10;
              if ((int)uVar5 < (int)uVar4) {
                iVar11 = iVar7;
                iVar7 = iVar10;
              }
              if ((short)uVar8 < 1) {
                __assert_fail("pCut->nSize > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivySeq.c"
                              ,0x2d6,"int Ivy_CutDeriveNew(Ivy_Cut_t *, Ivy_Cut_t *, int, int, int)"
                             );
              }
              if (iVar11 <= iVar7) {
                __assert_fail("IdNew0 < IdNew1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivySeq.c"
                              ,0x2d7,"int Ivy_CutDeriveNew(Ivy_Cut_t *, Ivy_Cut_t *, int, int, int)"
                             );
              }
              iVar10 = *(int *)(lVar12 * 0x24 + 0xddbf48 + lVar17 * 4);
              uVar13 = 0;
              iVar6 = 0;
              uVar9 = 0;
              do {
                iVar2 = *(int *)(lVar16 + uVar13 * 4);
                if (iVar2 != iVar10) {
                  if (iVar7 <= iVar2) {
                    if (iVar7 < iVar2) {
                      lVar15 = (long)iVar6;
                      iVar6 = iVar6 + 1;
                      local_54.pArray[lVar15] = iVar7;
                      uVar9 = uVar9 | 1 << (((uint)((ulong)((long)iVar7 * 0x84210843) >> 0x24) -
                                            (iVar7 >> 0x1f)) * -0x1f + iVar7 & 0x1f);
                    }
                    iVar7 = 0x7fffffff;
                  }
                  iVar14 = iVar11;
                  if ((iVar11 <= iVar2) && (iVar14 = 0x7fffffff, iVar11 < iVar2)) {
                    lVar15 = (long)iVar6;
                    iVar6 = iVar6 + 1;
                    local_54.pArray[lVar15] = iVar11;
                    uVar9 = uVar9 | 1 << (((uint)((ulong)((long)iVar11 * 0x84210843) >> 0x24) -
                                          (iVar11 >> 0x1f)) * -0x1f + iVar11 & 0x1f);
                  }
                  lVar15 = (long)iVar6;
                  iVar6 = iVar6 + 1;
                  local_54.pArray[lVar15] = iVar2;
                  uVar9 = uVar9 | 1 << (((uint)((ulong)((long)iVar2 * 0x84210843) >> 0x24) -
                                        (iVar2 >> 0x1f)) * -0x1f + iVar2 & 0x1f);
                  iVar11 = iVar14;
                }
                uVar13 = uVar13 + 1;
              } while (uVar8 != uVar13);
              if (iVar7 != 0x7fffffff) {
                lVar15 = (long)iVar6;
                iVar6 = iVar6 + 1;
                local_54.pArray[lVar15] = iVar7;
                uVar9 = uVar9 | 1 << (((uint)((ulong)((long)iVar7 * 0x84210843) >> 0x24) -
                                      (iVar7 >> 0x1f)) * -0x1f + iVar7 & 0x1f);
              }
              if (iVar11 != 0x7fffffff) {
                lVar15 = (long)iVar6;
                iVar6 = iVar6 + 1;
                local_54.pArray[lVar15] = iVar11;
                uVar9 = uVar9 | 1 << (((uint)((ulong)((long)iVar11 * 0x84210843) >> 0x24) -
                                      (iVar11 >> 0x1f)) * -0x1f + iVar11 & 0x1f);
              }
              local_54.nSize = (short)iVar6;
              local_54.uHash = uVar9;
              if (sVar1 < local_54.nSize) {
                __assert_fail("pCutNew->nSize <= pCut->nSizeMax",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivySeq.c"
                              ,0x2fd,"int Ivy_CutDeriveNew(Ivy_Cut_t *, Ivy_Cut_t *, int, int, int)"
                             );
              }
              Ivy_CutFindOrAddFilter(&Ivy_CutComputeForNode::CutStore,&local_54);
              if (Ivy_CutComputeForNode::CutStore.nCuts == 0x100) {
                Ivy_CutComputeForNode::CutStore.fSatur = 1;
                goto LAB_007a24cb;
              }
              uVar8 = Ivy_CutComputeForNode::CutStore.pCuts[lVar12].nSize;
            }
            else if (0 < (short)uVar8) {
              uVar13 = 0;
              do {
                iVar11 = *(int *)(lVar16 + uVar13 * 4);
                if ((iVar11 == iVar7) || (iVar11 == iVar10)) goto LAB_007a229c;
                uVar13 = uVar13 + 1;
              } while (uVar8 != uVar13);
            }
          }
          lVar17 = lVar17 + 1;
          iVar7 = Ivy_CutComputeForNode::CutStore.nCuts;
        } while (lVar17 < (short)uVar8);
      }
      if (iVar7 == 0x100) {
        iVar7 = 0x100;
        goto LAB_007a24c1;
      }
    }
    lVar12 = lVar12 + 1;
    lVar16 = lVar16 + 0x24;
    if (iVar7 <= lVar12) {
LAB_007a24c1:
      Ivy_CutComputeForNode::CutStore.fSatur = (int)(iVar7 == 0x100);
LAB_007a24cb:
      Ivy_CutCompactAll(&Ivy_CutComputeForNode::CutStore);
      return extraout_RAX;
    }
  } while( true );
}

Assistant:

Ivy_Store_t * Ivy_CutComputeForNode( Ivy_Man_t * p, Ivy_Obj_t * pObj, int nLeaves )
{
    static Ivy_Store_t CutStore, * pCutStore = &CutStore;
    Ivy_Cut_t CutNew, * pCutNew = &CutNew, * pCut;
    Ivy_Obj_t * pLeaf;
    int i, k, Temp, nLats, iLeaf0, iLeaf1;

    assert( nLeaves <= IVY_CUT_INPUT );

    // start the structure
    pCutStore->nCuts = 0;
    pCutStore->nCutsMax = IVY_CUT_LIMIT;
    // start the trivial cut
    pCutNew->uHash = 0;
    pCutNew->nSize = 1;
    pCutNew->nSizeMax = nLeaves;
    pCutNew->pArray[0] = Ivy_LeafCreate( pObj->Id, 0 );
    pCutNew->uHash = Ivy_CutHashValue( pCutNew->pArray[0] );
    // add the trivial cut
    pCutStore->pCuts[pCutStore->nCuts++] = *pCutNew;
    assert( pCutStore->nCuts == 1 );

    // explore the cuts
    for ( i = 0; i < pCutStore->nCuts; i++ )
    {
        // expand this cut
        pCut = pCutStore->pCuts + i;
        if ( pCut->nSize == 0 )
            continue;
        for ( k = 0; k < pCut->nSize; k++ )
        {
            pLeaf = Ivy_ManObj( p, Ivy_LeafId(pCut->pArray[k]) );
            if ( Ivy_ObjIsCi(pLeaf) || Ivy_ObjIsConst1(pLeaf) )
                continue;
            assert( Ivy_ObjIsNode(pLeaf) );
            nLats = Ivy_LeafLat(pCut->pArray[k]);

            // get the fanins fanins
            iLeaf0 = Ivy_CutReadLeaf( Ivy_ObjFanin0(pLeaf) );
            iLeaf1 = Ivy_CutReadLeaf( Ivy_ObjFanin1(pLeaf) );
            assert( nLats + Ivy_LeafLat(iLeaf0) < IVY_LEAF_MASK && nLats + Ivy_LeafLat(iLeaf1) < IVY_LEAF_MASK );
            iLeaf0 = nLats + iLeaf0;
            iLeaf1 = nLats + iLeaf1;
            if ( !Ivy_CutPrescreen( pCut, iLeaf0, iLeaf1 ) )
                continue;
            // the given cut exist
            if ( iLeaf0 > iLeaf1 )
                Temp = iLeaf0, iLeaf0 = iLeaf1, iLeaf1 = Temp;
            // create the new cut
            if ( !Ivy_CutDeriveNew( pCut, pCutNew, pCut->pArray[k], iLeaf0, iLeaf1 ) )
                continue;
            // add the cut
            Ivy_CutFindOrAddFilter( pCutStore, pCutNew );
            if ( pCutStore->nCuts == IVY_CUT_LIMIT )
                break;
        }
        if ( pCutStore->nCuts == IVY_CUT_LIMIT )
            break;
    }
    if ( pCutStore->nCuts == IVY_CUT_LIMIT )
        pCutStore->fSatur = 1;
    else
        pCutStore->fSatur = 0;
//    printf( "%d ", pCutStore->nCuts );
    Ivy_CutCompactAll( pCutStore );
//    printf( "%d \n", pCutStore->nCuts );
//    Ivy_CutPrintForNodes( pCutStore );
    return pCutStore;
}